

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

size_t __thiscall
iDynTree::SensorsMeasurements::getNrOfSensors(SensorsMeasurements *this,SensorType *sensor_type)

{
  undefined4 *in_RSI;
  long in_RDI;
  size_t returnVal;
  size_type local_18;
  
  switch(*in_RSI) {
  case 0:
    local_18 = std::vector<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_>::size
                         (*(vector<iDynTree::Wrench,_std::allocator<iDynTree::Wrench>_> **)
                           (in_RDI + 8));
    break;
  case 1:
    local_18 = std::vector<iDynTree::GeomVector3,_std::allocator<iDynTree::GeomVector3>_>::size
                         ((vector<iDynTree::GeomVector3,_std::allocator<iDynTree::GeomVector3>_> *)
                          (*(long *)(in_RDI + 8) + 0x30));
    break;
  case 2:
    local_18 = std::vector<iDynTree::GeomVector3,_std::allocator<iDynTree::GeomVector3>_>::size
                         ((vector<iDynTree::GeomVector3,_std::allocator<iDynTree::GeomVector3>_> *)
                          (*(long *)(in_RDI + 8) + 0x18));
    break;
  case 3:
    local_18 = std::
               vector<iDynTree::VectorFixSize<3U>,_std::allocator<iDynTree::VectorFixSize<3U>_>_>::
               size((vector<iDynTree::VectorFixSize<3U>,_std::allocator<iDynTree::VectorFixSize<3U>_>_>
                     *)(*(long *)(in_RDI + 8) + 0x48));
    break;
  case 4:
    local_18 = std::
               vector<iDynTree::VectorFixSize<3U>,_std::allocator<iDynTree::VectorFixSize<3U>_>_>::
               size((vector<iDynTree::VectorFixSize<3U>,_std::allocator<iDynTree::VectorFixSize<3U>_>_>
                     *)(*(long *)(in_RDI + 8) + 0x60));
    break;
  default:
    local_18 = 0;
  }
  return local_18;
}

Assistant:

std::size_t SensorsMeasurements::getNrOfSensors(const SensorType& sensor_type) const
{
    std::size_t returnVal = 0;
    switch (sensor_type)
    {
        case SIX_AXIS_FORCE_TORQUE :
            returnVal =  this->pimpl->SixAxisFTSensorsMeasurements.size();
            break;
        case ACCELEROMETER :
            returnVal =  this->pimpl->AccelerometerMeasurements.size();
            break;
        case GYROSCOPE :
            returnVal =  this->pimpl->GyroscopeMeasurements.size();
            break;
        case THREE_AXIS_ANGULAR_ACCELEROMETER :
            returnVal =  this->pimpl->ThreeAxisAngularAccelerometerMeasurements.size();
            break;
        case THREE_AXIS_FORCE_TORQUE_CONTACT :
            returnVal =  this->pimpl->ThreeAxisForceTorqueContactMeasurements.size();
            break;
        default :
            returnVal = 0;
    }
    return(returnVal);
}